

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

int ImGui::PlotEx(ImGuiPlotType plot_type,char *label,_func_float_void_ptr_int *values_getter,
                 void *data,int values_count,int values_offset,char *overlay_text,float scale_min,
                 float scale_max,ImVec2 frame_size)

{
  undefined1 auVar1 [12];
  ImU32 IVar2;
  undefined1 auVar3 [16];
  ImVec2 p_max;
  bool bVar4;
  ImGuiID id;
  ImU32 IVar5;
  int iVar6;
  ImU32 IVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  ImGuiContext *g;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined4 in_XMM0_Db;
  ImVec2 IVar15;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar16 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined8 in_XMM2_Qb;
  float fVar17;
  undefined8 uVar19;
  undefined1 auVar18 [16];
  float fVar20;
  ImVec2 pos1;
  ImVec2 pos0;
  ImRect frame_bb;
  ImRect total_bb;
  ImVec2 local_130;
  ImGuiContext *local_128;
  void *local_120;
  ImGuiWindow *local_118;
  ImVec2 local_110;
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  ImVec2 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ImRect local_a0;
  char *local_90;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImRect local_40;
  
  pIVar8 = GImGui;
  local_118 = GImGui->CurrentWindow;
  local_118->WriteAccessed = true;
  uVar10 = 0xffffffff;
  if (local_118->SkipItems == false) {
    local_d8._4_4_ = in_XMM1_Db;
    local_d8._0_4_ = scale_max;
    local_d8._8_4_ = in_XMM1_Dc;
    local_d8._12_4_ = in_XMM1_Dd;
    local_108._8_8_ = in_XMM2_Qb;
    local_108._0_8_ = frame_size;
    local_120 = data;
    local_b8 = scale_min;
    uStack_b4 = in_XMM0_Db;
    uStack_b0 = in_XMM0_Dc;
    uStack_ac = in_XMM0_Dd;
    id = ImGuiWindow::GetID(local_118,label,(char *)0x0);
    IVar15 = CalcTextSize(label,(char *)0x0,true,-1.0);
    uVar19 = local_108._8_8_;
    local_88 = IVar15.x;
    fStack_84 = IVar15.y;
    if ((local_108._0_4_ == 0.0) && (!NAN(local_108._0_4_))) {
      fVar12 = CalcItemWidth();
      auVar1._4_8_ = uVar19;
      auVar1._0_4_ = local_108._4_4_;
      auVar18._0_8_ = auVar1._0_8_ << 0x20;
      auVar18._8_4_ = local_108._8_4_;
      auVar18._12_4_ = local_108._12_4_;
      IVar15.y = fStack_84;
      IVar15.x = local_88;
      local_108._4_12_ = auVar18._4_12_;
      local_108._0_4_ = fVar12;
    }
    if ((local_108._4_4_ == 0.0) && (!NAN(local_108._4_4_))) {
      fVar12 = (pIVar8->Style).FramePadding.y;
      local_108._4_4_ = fVar12 + fVar12 + IVar15.y;
    }
    local_a0.Min = (local_118->DC).CursorPos;
    local_c8 = local_a0.Min.x;
    local_f8 = local_108._0_4_ + local_c8;
    fStack_c4 = local_a0.Min.y;
    fStack_f4 = local_108._4_4_ + fStack_c4;
    fStack_f0 = local_108._8_4_ + 0.0;
    fStack_ec = local_108._12_4_ + 0.0;
    fStack_c0 = 0.0;
    fStack_bc = 0.0;
    local_a0.Max.y = fStack_f4;
    local_a0.Max.x = local_f8;
    fVar12 = 0.0;
    if (0.0 < IVar15.x) {
      fVar12 = (pIVar8->Style).ItemInnerSpacing.x + IVar15.x;
    }
    local_e8 = (pIVar8->Style).FramePadding;
    uStack_e0 = 0;
    local_40.Max.y = fStack_f4 + 0.0;
    local_40.Max.x = fVar12 + local_f8;
    local_128 = pIVar8;
    local_40.Min = local_a0.Min;
    ItemSize(&local_40,(pIVar8->Style).FramePadding.y);
    bVar4 = ItemAdd(&local_40,0,&local_a0);
    uVar10 = 0xffffffff;
    if (bVar4) {
      bVar4 = ItemHoverable(&local_a0,id);
      pIVar8 = local_128;
      if (((local_b8 == 3.4028235e+38) && (!NAN(local_b8))) ||
         (((float)local_d8._0_4_ == 3.4028235e+38 && (!NAN((float)local_d8._0_4_))))) {
        if (values_count < 1) {
          fVar14 = -3.4028235e+38;
          fVar12 = 3.4028235e+38;
        }
        else {
          iVar9 = 0;
          fVar14 = -3.4028235e+38;
          fVar12 = 3.4028235e+38;
          do {
            fVar13 = (*values_getter)(local_120,iVar9);
            if (!NAN(fVar13)) {
              if (fVar13 <= fVar12) {
                fVar12 = fVar13;
              }
              fVar14 = (float)((uint)fVar14 & -(uint)(fVar13 <= fVar14) |
                              ~-(uint)(fVar13 <= fVar14) & (uint)fVar13);
            }
            iVar9 = iVar9 + 1;
          } while (values_count != iVar9);
        }
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        local_b8 = (float)(~-(uint)(local_b8 == 3.4028235e+38) & (uint)local_b8 |
                          (uint)fVar12 & -(uint)(local_b8 == 3.4028235e+38));
        local_d8._0_4_ =
             ~-(uint)((float)local_d8._0_4_ == 3.4028235e+38) & local_d8._0_4_ |
             (uint)fVar14 & -(uint)((float)local_d8._0_4_ == 3.4028235e+38);
      }
      p_max = local_a0.Max;
      IVar15 = local_a0.Min;
      local_c8 = local_c8 + local_e8.x;
      fStack_c4 = fStack_c4 + local_e8.y;
      fStack_c0 = fStack_c0 + (float)uStack_e0;
      fStack_bc = fStack_bc + uStack_e0._4_4_;
      IVar5 = GetColorU32(7,1.0);
      RenderFrame(IVar15,p_max,IVar5,true,(pIVar8->Style).FrameRounding);
      uVar10 = 0xffffffff;
      if ((int)((plot_type == ImGuiPlotType_Lines) + 1) <= values_count) {
        local_f8 = local_f8 - local_e8.x;
        fStack_f4 = fStack_f4 - local_e8.y;
        fStack_f0 = fStack_f0 - (float)uStack_e0;
        fStack_ec = fStack_ec - uStack_e0._4_4_;
        iVar9 = (int)(float)local_108._0_4_;
        if (values_count <= (int)(float)local_108._0_4_) {
          iVar9 = values_count;
        }
        iVar6 = values_count - (uint)(plot_type == ImGuiPlotType_Lines);
        uVar10 = 0xffffffff;
        if ((((bVar4) && (fVar12 = (local_128->IO).MousePos.x, local_c8 <= fVar12)) &&
            (fVar14 = (local_128->IO).MousePos.y, fStack_c4 <= fVar14)) &&
           ((fVar12 < local_f8 && (fVar14 < fStack_f4)))) {
          fVar14 = (fVar12 - local_c8) / (local_f8 - local_c8);
          fVar12 = 0.9999;
          if (fVar14 <= 0.9999) {
            fVar12 = fVar14;
          }
          uVar10 = (uint)((float)iVar6 * (float)(~-(uint)(fVar14 < 0.0) & (uint)fVar12));
          fVar12 = (*values_getter)(local_120,(int)(values_offset + uVar10) % values_count);
          (*values_getter)(local_120,(int)(values_offset + uVar10 + 1) % values_count);
          if (plot_type == ImGuiPlotType_Lines) {
            SetTooltip("%d: %8.4g\n%d: %8.4g",(ulong)uVar10,(ulong)(uVar10 + 1));
          }
          else if (plot_type == ImGuiPlotType_Histogram) {
            SetTooltip("%d: %8.4g",(double)fVar12,(ulong)uVar10);
          }
        }
        iVar9 = iVar9 - (uint)(plot_type == ImGuiPlotType_Lines);
        local_108 = ZEXT416(~-(uint)(local_b8 == (float)local_d8._0_4_) &
                            (uint)(1.0 / ((float)local_d8._0_4_ - local_b8)));
        fVar12 = (*values_getter)(local_120,values_offset % values_count);
        local_e8.x = fVar12;
        if (0.0 <= (float)local_d8._0_4_ * local_b8) {
          fVar12 = (float)(~-(uint)(local_b8 < 0.0) & 0x3f800000);
        }
        else {
          fVar12 = -local_b8 * (float)local_108._0_4_;
        }
        IVar5 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x26,1.0);
        IVar7 = GetColorU32((uint)(plot_type != ImGuiPlotType_Lines) * 2 + 0x27,1.0);
        pIVar8 = local_128;
        if (0 < iVar9) {
          fVar13 = (float)local_108._0_4_ * (local_e8.x - local_b8);
          fVar14 = 1.0;
          if (fVar13 <= 1.0) {
            fVar14 = fVar13;
          }
          local_d8 = ZEXT416((uint)(1.0 / (float)iVar9));
          local_e8.x = (float)iVar6;
          local_f8 = local_f8 - local_c8;
          fStack_f4 = fStack_f4 - fStack_c4;
          fStack_f0 = fStack_f0 - fStack_c0;
          fStack_ec = fStack_ec - fStack_bc;
          local_78 = fStack_c4;
          fStack_74 = fStack_c4;
          fStack_70 = fStack_c4;
          fStack_6c = fStack_c4;
          local_58 = fStack_f4 * fVar12 + fStack_c4;
          fVar12 = 0.0;
          fVar14 = (float)(-(uint)(fVar13 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar13 < 0.0) & (uint)(1.0 - fVar14));
          local_90 = label;
          local_68 = fStack_f4;
          fStack_64 = fStack_f4;
          fStack_60 = fStack_f4;
          fStack_5c = fStack_f4;
          fStack_54 = fStack_f4;
          fStack_50 = fStack_f4;
          fStack_4c = fStack_f4;
          do {
            uVar11 = (uint)(fVar12 * local_e8.x + 0.5);
            fVar13 = (*values_getter)(local_120,(int)(values_offset + 1 + uVar11) % values_count);
            fVar17 = (float)local_d8._0_4_ + fVar12;
            fVar20 = (fVar13 - local_b8) * (float)local_108._0_4_;
            fVar13 = 1.0;
            if (fVar20 <= 1.0) {
              fVar13 = fVar20;
            }
            fVar13 = (float)(-(uint)(fVar20 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar20 < 0.0) & (uint)(1.0 - fVar13));
            fVar12 = fVar12 * local_f8 + local_c8;
            local_110.y = fVar14 * fStack_f4 + fStack_c4;
            local_110.x = fVar12;
            local_130.x = local_f8 * fVar17 + local_c8;
            if (plot_type == ImGuiPlotType_Lines) {
              local_130.y = local_68 * fVar13 + local_78;
              IVar2 = IVar5;
              if (uVar10 == uVar11) {
                IVar2 = IVar7;
              }
              ImDrawList::AddLine(local_118->DrawList,&local_110,&local_130,IVar2,1.0);
            }
            else {
              local_130.y = local_58;
              if (plot_type == ImGuiPlotType_Histogram) {
                if (fVar12 + 2.0 <= local_130.x) {
                  local_130.x = local_130.x + -1.0;
                }
                IVar2 = IVar5;
                if (uVar10 == uVar11) {
                  IVar2 = IVar7;
                }
                ImDrawList::AddRectFilled(local_118->DrawList,&local_110,&local_130,IVar2,0.0,0xf);
              }
            }
            iVar9 = iVar9 + -1;
            pIVar8 = local_128;
            label = local_90;
            fVar12 = fVar17;
            fVar14 = fVar13;
          } while (iVar9 != 0);
        }
      }
      if (overlay_text != (char *)0x0) {
        local_110.y = local_a0.Min.y + (pIVar8->Style).FramePadding.y;
        local_110.x = local_a0.Min.x;
        local_130.x = 0.5;
        local_130.y = 0.0;
        RenderTextClipped(&local_110,&local_a0.Max,overlay_text,(char *)0x0,(ImVec2 *)0x0,&local_130
                          ,(ImRect *)0x0);
      }
      if (0.0 < local_88) {
        auVar3._4_4_ = fStack_c4;
        auVar3._0_4_ = local_c8;
        auVar3._8_4_ = fStack_c0;
        auVar3._12_4_ = fStack_bc;
        auVar16._4_12_ = auVar3._4_12_;
        auVar16._0_4_ = local_a0.Max.x + (pIVar8->Style).ItemInnerSpacing.x;
        RenderText(auVar16._0_8_,label,(char *)0x0,true);
      }
    }
  }
  return uVar10;
}

Assistant:

int ImGui::PlotEx(ImGuiPlotType plot_type, const char* label, float (*values_getter)(void* data, int idx), void* data, int values_count, int values_offset, const char* overlay_text, float scale_min, float scale_max, ImVec2 frame_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return -1;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (frame_size.x == 0.0f)
        frame_size.x = CalcItemWidth();
    if (frame_size.y == 0.0f)
        frame_size.y = label_size.y + (style.FramePadding.y * 2);

    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, 0, &frame_bb))
        return -1;
    const bool hovered = ItemHoverable(frame_bb, id);

    // Determine scale from values if not specified
    if (scale_min == FLT_MAX || scale_max == FLT_MAX)
    {
        float v_min = FLT_MAX;
        float v_max = -FLT_MAX;
        for (int i = 0; i < values_count; i++)
        {
            const float v = values_getter(data, i);
            if (v != v) // Ignore NaN values
                continue;
            v_min = ImMin(v_min, v);
            v_max = ImMax(v_max, v);
        }
        if (scale_min == FLT_MAX)
            scale_min = v_min;
        if (scale_max == FLT_MAX)
            scale_max = v_max;
    }

    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const int values_count_min = (plot_type == ImGuiPlotType_Lines) ? 2 : 1;
    int idx_hovered = -1;
    if (values_count >= values_count_min)
    {
        int res_w = ImMin((int)frame_size.x, values_count) + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);
        int item_count = values_count + ((plot_type == ImGuiPlotType_Lines) ? -1 : 0);

        // Tooltip on hover
        if (hovered && inner_bb.Contains(g.IO.MousePos))
        {
            const float t = ImClamp((g.IO.MousePos.x - inner_bb.Min.x) / (inner_bb.Max.x - inner_bb.Min.x), 0.0f, 0.9999f);
            const int v_idx = (int)(t * item_count);
            IM_ASSERT(v_idx >= 0 && v_idx < values_count);

            const float v0 = values_getter(data, (v_idx + values_offset) % values_count);
            const float v1 = values_getter(data, (v_idx + 1 + values_offset) % values_count);
            if (plot_type == ImGuiPlotType_Lines)
                SetTooltip("%d: %8.4g\n%d: %8.4g", v_idx, v0, v_idx + 1, v1);
            else if (plot_type == ImGuiPlotType_Histogram)
                SetTooltip("%d: %8.4g", v_idx, v0);
            idx_hovered = v_idx;
        }

        const float t_step = 1.0f / (float)res_w;
        const float inv_scale = (scale_min == scale_max) ? 0.0f : (1.0f / (scale_max - scale_min));

        float v0 = values_getter(data, (0 + values_offset) % values_count);
        float t0 = 0.0f;
        ImVec2 tp0 = ImVec2( t0, 1.0f - ImSaturate((v0 - scale_min) * inv_scale) );                       // Point in the normalized space of our target rectangle
        float histogram_zero_line_t = (scale_min * scale_max < 0.0f) ? (-scale_min * inv_scale) : (scale_min < 0.0f ? 0.0f : 1.0f);   // Where does the zero line stands

        const ImU32 col_base = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLines : ImGuiCol_PlotHistogram);
        const ImU32 col_hovered = GetColorU32((plot_type == ImGuiPlotType_Lines) ? ImGuiCol_PlotLinesHovered : ImGuiCol_PlotHistogramHovered);

        for (int n = 0; n < res_w; n++)
        {
            const float t1 = t0 + t_step;
            const int v1_idx = (int)(t0 * item_count + 0.5f);
            IM_ASSERT(v1_idx >= 0 && v1_idx < values_count);
            const float v1 = values_getter(data, (v1_idx + values_offset + 1) % values_count);
            const ImVec2 tp1 = ImVec2( t1, 1.0f - ImSaturate((v1 - scale_min) * inv_scale) );

            // NB: Draw calls are merged together by the DrawList system. Still, we should render our batch are lower level to save a bit of CPU.
            ImVec2 pos0 = ImLerp(inner_bb.Min, inner_bb.Max, tp0);
            ImVec2 pos1 = ImLerp(inner_bb.Min, inner_bb.Max, (plot_type == ImGuiPlotType_Lines) ? tp1 : ImVec2(tp1.x, histogram_zero_line_t));
            if (plot_type == ImGuiPlotType_Lines)
            {
                window->DrawList->AddLine(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }
            else if (plot_type == ImGuiPlotType_Histogram)
            {
                if (pos1.x >= pos0.x + 2.0f)
                    pos1.x -= 1.0f;
                window->DrawList->AddRectFilled(pos0, pos1, idx_hovered == v1_idx ? col_hovered : col_base);
            }

            t0 = t1;
            tp0 = tp1;
        }
    }

    // Text overlay
    if (overlay_text)
        RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, overlay_text, NULL, NULL, ImVec2(0.5f, 0.0f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    // Return hovered index or -1 if none are hovered.
    // This is currently not exposed in the public API because we need a larger redesign of the whole thing, but in the short-term we are making it available in PlotEx().
    return idx_hovered;
}